

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

FBehavior * FBehavior::StaticLoadModule(int lumpnum,FileReader *fr,int len)

{
  bool bVar1;
  FBehavior *pFVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (lumpnum == -1 && fr == (FileReader *)0x0) {
    pFVar2 = (FBehavior *)0x0;
  }
  else {
    uVar4 = 0;
    do {
      if (StaticModules.Count == uVar4) {
        pFVar2 = (FBehavior *)operator_new(0x698);
        FBehavior(pFVar2);
        bVar1 = Init(pFVar2,lumpnum,fr,len);
        if (bVar1) {
          return pFVar2;
        }
        ~FBehavior(pFVar2);
        operator_delete(pFVar2,0x698);
        pcVar3 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
        Printf("\x1cG%s: invalid ACS module\n",pcVar3);
        return (FBehavior *)0x0;
      }
      pFVar2 = StaticModules.Array[uVar4];
      uVar4 = uVar4 + 1;
    } while (pFVar2->LumpNum != lumpnum);
  }
  return pFVar2;
}

Assistant:

FBehavior *FBehavior::StaticLoadModule (int lumpnum, FileReader *fr, int len)
{
	if (lumpnum == -1 && fr == NULL) return NULL;

	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (StaticModules[i]->LumpNum == lumpnum)
		{
			return StaticModules[i];
		}
	}

	FBehavior * behavior = new FBehavior ();
	if (behavior->Init(lumpnum, fr, len))
	{
		return behavior;
	}
	else
	{
		delete behavior;
		Printf(TEXTCOLOR_RED "%s: invalid ACS module\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
}